

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImageLoaderBMP.cpp
# Opt level: O0

void __thiscall
irr::video::CImageLoaderBMP::decompress8BitRLE
          (CImageLoaderBMP *this,u8 **bmpData,s32 size,s32 width,s32 height,s32 pitch)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  byte *end;
  byte *pbVar5;
  byte *end_00;
  byte *base;
  int in_ECX;
  int in_EDX;
  int iVar6;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  s32 i_2;
  u8 color;
  s32 count_1;
  s32 i_1;
  s32 i;
  s32 readAdditional;
  s32 count;
  s32 line;
  u8 *destEnd;
  u8 *d;
  u8 *newBmp;
  u8 *pEnd;
  u8 *p;
  int local_68;
  int local_5c;
  int local_58;
  int local_4c;
  byte *local_40;
  byte *local_28;
  
  local_28 = (byte *)*in_RSI;
  end = (byte *)(*in_RSI + (long)in_EDX);
  pbVar5 = (byte *)operator_new__((long)((in_ECX + in_R9D) * in_R8D));
  end_00 = pbVar5 + (in_ECX + in_R9D) * in_R8D;
  local_4c = 0;
  local_40 = pbVar5;
  while (local_28 < end && local_40 < end_00) {
    if (*local_28 == 0) {
      base = local_28 + 1;
      bVar3 = overflowCheck(base,1,end);
      if (bVar3) break;
      bVar1 = *base;
      if (bVar1 == 0) {
        local_28 = local_28 + 2;
        local_4c = local_4c + 1;
        local_40 = pbVar5 + local_4c * (in_ECX + in_R9D);
      }
      else {
        if (bVar1 == 1) break;
        if (bVar1 == 2) {
          bVar3 = overflowCheck(local_28 + 2,2,end);
          if (bVar3) break;
          local_40 = local_40 +
                     (long)(int)((uint)local_28[3] * (in_ECX + in_R9D)) +
                     (long)(int)(uint)local_28[2];
          local_28 = local_28 + 4;
        }
        else {
          uVar4 = (uint)*base;
          local_28 = local_28 + 2;
          iVar6 = (int)(2 - uVar4 % 2) % 2;
          bVar3 = overflowCheck(local_28,(long)(int)uVar4,end);
          if ((bVar3) || (bVar3 = overflowCheck(local_40,(long)(int)uVar4,end_00), bVar3)) break;
          for (local_58 = 0; local_58 < (int)uVar4; local_58 = local_58 + 1) {
            *local_40 = *local_28;
            local_28 = local_28 + 1;
            local_40 = local_40 + 1;
          }
          if ((iVar6 < 0) || (bVar3 = overflowCheck(local_28,(long)iVar6,end), bVar3)) break;
          for (local_5c = 0; local_5c < iVar6; local_5c = local_5c + 1) {
            local_28 = local_28 + 1;
          }
        }
      }
    }
    else {
      bVar1 = *local_28;
      bVar3 = overflowCheck(local_28 + 1,1,end);
      if (bVar3) break;
      bVar2 = local_28[1];
      local_28 = local_28 + 2;
      bVar3 = overflowCheck(local_40,(long)(int)(uint)bVar1,end_00);
      if (bVar3) break;
      for (local_68 = 0; local_68 < (int)(uint)bVar1; local_68 = local_68 + 1) {
        *local_40 = bVar2;
        local_40 = local_40 + 1;
      }
    }
  }
  if ((void *)*in_RSI != (void *)0x0) {
    operator_delete__((void *)*in_RSI);
  }
  *in_RSI = (long)pbVar5;
  return;
}

Assistant:

void CImageLoaderBMP::decompress8BitRLE(u8 *&bmpData, s32 size, s32 width, s32 height, s32 pitch) const
{
	u8 *p = bmpData;
	const u8 *pEnd = bmpData + size;
	u8 *newBmp = new u8[(width + pitch) * height];
	u8 *d = newBmp;
	const u8 *destEnd = newBmp + (width + pitch) * height;
	s32 line = 0;

	while (p < pEnd && d < destEnd) {
		if (*p == 0) {
			++p;
			CHECKP(1);

			switch (*p) {
			case 0: // end of line
				++p;
				++line;
				d = newBmp + (line * (width + pitch));
				break;
			case 1: // end of bmp
				goto exit;
			case 2:
				++p;
				CHECKP(2);
				d += (u8)*p;
				++p; // delta
				d += ((u8)*p) * (width + pitch);
				++p;
				break;
			default: {
				// absolute mode
				s32 count = (u8)*p;
				++p;
				s32 readAdditional = ((2 - (count % 2)) % 2);

				CHECKP(count);
				CHECKD(count);
				for (s32 i = 0; i < count; ++i) {
					*d = *p;
					++p;
					++d;
				}

				CHECKP(readAdditional);
				for (s32 i = 0; i < readAdditional; ++i)
					++p;
			}
			}
		} else {
			s32 count = (u8)*p;
			++p;
			CHECKP(1);
			u8 color = *p;
			++p;
			CHECKD(count);
			for (s32 i = 0; i < count; ++i) {
				*d = color;
				++d;
			}
		}
	}

exit:
	delete[] bmpData;
	bmpData = newBmp;
}